

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPlotIO.cpp
# Opt level: O0

bool __thiscall NaDPlotFile::GoNextRecord(NaDPlotFile *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long *in_RDI;
  bool local_1;
  
  iVar2 = NaDynAr<NaVector>::count((NaDynAr<NaVector> *)(in_RDI + 6));
  if (iVar2 == 0) {
    local_1 = false;
  }
  else {
    lVar1 = in_RDI[5];
    lVar3 = (**(code **)(*in_RDI + 0x38))();
    if (lVar1 < lVar3) {
      in_RDI[5] = in_RDI[5] + 1;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool    NaDPlotFile::GoNextRecord ()
{
    if(0 == aVars.count())
        return false;
    if(iCase >= CountOfRecord())
        return false;

    ++iCase;
    return true;
}